

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O2

void __thiscall mjs::break_statement::print(break_statement *this,wostream *os)

{
  std::operator<<(os,"break_statement{");
  if ((this->id_)._M_string_length != 0) {
    std::operator<<(os,(wstring *)&this->id_);
  }
  std::operator<<(os,"}");
  return;
}

Assistant:

void print(std::wostream& os) const override {
        os << "break_statement{";
        if (!id_.empty()) {
            os << id_;
        }
        os << "}";
    }